

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O1

void __thiscall TadsServerThread::~TadsServerThread(TadsServerThread *this)

{
  OS_Counter *pOVar1;
  OS_Socket *pOVar2;
  OS_Mutex *pOVar3;
  StringRef *pSVar4;
  
  (this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsServerThread_00352c08;
  (this->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__TadsServerThread_00352c40;
  pOVar2 = this->socket;
  LOCK();
  pOVar1 = &(pOVar2->super_OS_CoreSocket).super_CVmRefCntObj.cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar2->super_OS_CoreSocket).super_CVmRefCntObj._vptr_CVmRefCntObj[1])();
  }
  CVmWeakRefable::release_ref((CVmWeakRefable *)this->listener);
  pOVar3 = this->mutex;
  LOCK();
  pOVar1 = &(pOVar3->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pSVar4 = this->state;
  LOCK();
  pOVar1 = &(pSVar4->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pSVar4->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  if (this->client_ip != (char *)0x0) {
    free(this->client_ip);
  }
  OS_Thread::~OS_Thread(&this->super_OS_Thread);
  return;
}

Assistant:

~TadsServerThread()
    {
        /* release our resources */
        socket->release_ref();
        listener->release_ref();
        mutex->release_ref();
        state->release_ref();
        if (client_ip != 0)
            t3free(client_ip);
    }